

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRSystem.cpp
# Opt level: O0

time_t __thiscall MinVR::VRSystem::time(VRSystem *this,time_t *__timer)

{
  timeval now;
  double timeOffset;
  timeval local_28;
  double local_18;
  byte local_9;
  VRSystem *local_8;
  
  local_9 = (byte)__timer & 1;
  local_18 = 0.0;
  if (((ulong)__timer & 1) != 0) {
    local_18 = this->initialTime;
  }
  local_8 = this;
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  return local_28.tv_usec - (this->start).tv_usec;
}

Assistant:

double VRSystem::time(bool absolute) {
	double timeOffset = 0.0;
	if (absolute) {
		timeOffset = initialTime;
	}

#if defined(WIN32)
        LARGE_INTEGER now;
        QueryPerformanceCounter(&now);

		return ((double)(now.QuadPart - timeStart.QuadPart) /
                counterFrequency.QuadPart) + timeOffset;
#else
        // Linux resolution defaults to 100Hz.
        // There is no need to do a separate RDTSC call as gettimeofday
        // actually uses RDTSC when on systems that support it, otherwise
        // it uses the system clock.
        struct timeval now;
        gettimeofday(&now, NULL);

        return (now.tv_sec  - start.tv_sec) +
            (now.tv_usec - start.tv_usec) / 1e6 + timeOffset;
#endif
}